

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int av1_neg_deinterleave(int diff,int ref,int max)

{
  if (ref == 0) {
    return diff;
  }
  if (max + -1 <= ref) {
LAB_001778d9:
    return ~diff + max;
  }
  if (ref * 2 < max) {
    if (ref * 2 < diff) {
      return diff;
    }
  }
  else if ((~ref + max) * 2 < diff) goto LAB_001778d9;
  if ((diff & 1U) != 0) {
    return (diff + 1 >> 1) + ref;
  }
  return ref - (diff >> 1);
}

Assistant:

int av1_neg_deinterleave(int diff, int ref, int max) {
  if (!ref) return diff;
  if (ref >= (max - 1)) return max - diff - 1;
  if (2 * ref < max) {
    if (diff <= 2 * ref) {
      if (diff & 1)
        return ref + ((diff + 1) >> 1);
      else
        return ref - (diff >> 1);
    }
    return diff;
  } else {
    if (diff <= 2 * (max - ref - 1)) {
      if (diff & 1)
        return ref + ((diff + 1) >> 1);
      else
        return ref - (diff >> 1);
    }
    return max - (diff + 1);
  }
}